

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderFunctions.cpp
# Opt level: O2

void __thiscall wasm::CallCountScanner::visitCall(CallCountScanner *this,Call *curr)

{
  size_type sVar1;
  mapped_type *pmVar2;
  
  sVar1 = std::
          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count(&this->counts->_M_h,&curr->target);
  if (sVar1 != 0) {
    pmVar2 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this->counts,&curr->target);
    LOCK();
    (pmVar2->super___atomic_base<unsigned_int>)._M_i =
         (pmVar2->super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
    return;
  }
  __assert_fail("counts->count(curr->target) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/ReorderFunctions.cpp"
                ,0x35,"void wasm::CallCountScanner::visitCall(Call *)");
}

Assistant:

void visitCall(Call* curr) {
    // can't add a new element in parallel
    assert(counts->count(curr->target) > 0);
    (*counts)[curr->target]++;
  }